

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

CLBool * __thiscall CLBool::operator=(CLBool *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,(other->_M_dataplus)._M_p,other->_M_string_length);
  std::istream::_M_extract<bool>((bool *)asStack_198);
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return this;
}

Assistant:

CLBool& operator=(std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        return *this ;
    }